

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O3

size_t STRING_length(STRING_HANDLE handle)

{
  size_t sVar1;
  
  if (handle != (STRING_HANDLE)0x0) {
    sVar1 = strlen(handle->s);
    return sVar1;
  }
  return 0;
}

Assistant:

size_t STRING_length(STRING_HANDLE handle)
{
    size_t result = 0;
    /* Codes_SRS_STRING_07_025: [STRING_length shall return zero if the given handle is NULL.] */
    if (handle != NULL)
    {
        STRING* value = (STRING*)handle;
        result = strlen(value->s);
    }
    return result;
}